

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseParser.cpp
# Opt level: O0

void __thiscall phpconvert::BaseParser::~BaseParser(BaseParser *this)

{
  BaseParser *this_local;
  
  this->_vptr_BaseParser = (_func_int **)&PTR__BaseParser_001a0c30;
  std::__cxx11::string::~string((string *)&this->outputDir);
  std::__cxx11::string::~string((string *)&this->sourceDir);
  return;
}

Assistant:

BaseParser::~BaseParser() {
    }